

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O0

void FillKeyBuffer(LPPSTR a,LPBYTE kb,UINT *count,UINT n,UINT d)

{
  uchar uVar1;
  uchar *puVar2;
  ulong local_50;
  size_t i_1;
  uchar c;
  uint j;
  uchar *str;
  size_t i;
  UINT d_local;
  UINT n_local;
  UINT *count_local;
  LPBYTE kb_local;
  LPPSTR a_local;
  
  for (str = (uchar *)0x0; str < n; str = str + 1) {
    puVar2 = a[(long)str];
    i_1._4_4_ = 0;
    while ((i_1._4_4_ < 4 &&
           (uVar1 = puVar2[d + i_1._4_4_], kb[(long)str * 4 + (ulong)i_1._4_4_] = uVar1,
           uVar1 != '\0'))) {
      i_1._4_4_ = i_1._4_4_ + 1;
    }
    if (i_1._4_4_ < 4) {
      kb[(long)str * 4 + (ulong)i_1._4_4_] = '\0';
    }
  }
  for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
    count[kb[local_50 * 4]] = count[kb[local_50 * 4]] + 1;
  }
  return;
}

Assistant:

static
void FillKeyBuffer(LPPSTR a, LPBYTE kb, UINT* count, UINT n, UINT d)
{
	UINT i, j; LPSTR c, x;
	for (i=0; i<n; i++) {
		x=a[i]+d; count[*x]++;
		for (j=0, c=x; *c!=0 && j<BS; j++)
		{ *kb=*c; kb++; c++; }
		if (j<BS) { *kb='\0'; kb+=BS-j; }
	}
}